

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ElsePropertyClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElsePropertyClauseSyntax,slang::syntax::ElsePropertyClauseSyntax_const&>
          (BumpAllocator *this,ElsePropertyClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  PropertyExprSyntax *pPVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  ElsePropertyClauseSyntax *pEVar10;
  
  pEVar10 = (ElsePropertyClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ElsePropertyClauseSyntax *)this->endPtr < pEVar10 + 1) {
    pEVar10 = (ElsePropertyClauseSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pEVar10 + 1);
  }
  SVar8 = (args->super_SyntaxNode).kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar4 = (args->elseKeyword).kind;
  uVar5 = (args->elseKeyword).field_0x2;
  NVar6.raw = (args->elseKeyword).numFlags.raw;
  uVar7 = (args->elseKeyword).rawLen;
  pPVar3 = (args->expr).ptr;
  (pEVar10->elseKeyword).info = (args->elseKeyword).info;
  (pEVar10->expr).ptr = pPVar3;
  (pEVar10->super_SyntaxNode).previewNode = pSVar2;
  (pEVar10->elseKeyword).kind = TVar4;
  (pEVar10->elseKeyword).field_0x2 = uVar5;
  (pEVar10->elseKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pEVar10->elseKeyword).rawLen = uVar7;
  (pEVar10->super_SyntaxNode).kind = SVar8;
  *(undefined4 *)&(pEVar10->super_SyntaxNode).field_0x4 = uVar9;
  (pEVar10->super_SyntaxNode).parent = pSVar1;
  return pEVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }